

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

uint32_t __thiscall
spirv_cross::Compiler::get_work_group_size_specialization_constants
          (Compiler *this,SpecializationConstant *x,SpecializationConstant *y,
          SpecializationConstant *z)

{
  _Hash_node_base *p_Var1;
  uint32_t uVar2;
  __node_base_ptr p_Var3;
  SPIRConstant *pSVar4;
  ulong __code;
  ID *pIVar5;
  
  __code = (ulong)(this->ir).default_entry_point.id;
  p_Var3 = ::std::
           _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)4>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->ir).entry_points._M_h,
                      __code % (this->ir).entry_points._M_h._M_bucket_count,
                      &(this->ir).default_entry_point,__code);
  p_Var1 = p_Var3->_M_nxt;
  x->id = 0;
  x->constant_id = 0;
  y->id = 0;
  y->constant_id = 0;
  z->id = 0;
  z->constant_id = 0;
  if ((ulong)*(uint *)&p_Var1[0x1d]._M_nxt == 0) {
    if (((ulong)p_Var1[0x12]._M_nxt & 0x4000000000) == 0) goto LAB_002c804c;
    pSVar4 = Variant::get<spirv_cross::SPIRConstant>
                       ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                        *(uint *)((long)&p_Var1[0x1b]._M_nxt + 4));
    if (pSVar4->specialization == true) {
      (x->id).id = *(uint32_t *)((long)&p_Var1[0x1b]._M_nxt + 4);
      uVar2 = ParsedIR::get_decoration
                        (&this->ir,(ID)*(uint32_t *)((long)&p_Var1[0x1b]._M_nxt + 4),
                         DecorationSpecId);
      x->constant_id = uVar2;
    }
    pSVar4 = Variant::get<spirv_cross::SPIRConstant>
                       ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                        *(uint *)&p_Var1[0x1c]._M_nxt);
    if (pSVar4->specialization == true) {
      (y->id).id = *(uint32_t *)&p_Var1[0x1c]._M_nxt;
      uVar2 = ParsedIR::get_decoration
                        (&this->ir,(ID)*(uint32_t *)&p_Var1[0x1c]._M_nxt,DecorationSpecId);
      y->constant_id = uVar2;
    }
    pSVar4 = Variant::get<spirv_cross::SPIRConstant>
                       ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                        *(uint *)((long)&p_Var1[0x1c]._M_nxt + 4));
    if (pSVar4->specialization != true) goto LAB_002c804c;
    pIVar5 = (ID *)((long)&p_Var1[0x1c]._M_nxt + 4);
    uVar2 = pIVar5->id;
  }
  else {
    pSVar4 = Variant::get<spirv_cross::SPIRConstant>
                       ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                        *(uint *)&p_Var1[0x1d]._M_nxt);
    uVar2 = (pSVar4->m).c[0].id[0].id;
    if (uVar2 != 0) {
      (x->id).id = uVar2;
      uVar2 = ParsedIR::get_decoration(&this->ir,(ID)(pSVar4->m).c[0].id[0].id,DecorationSpecId);
      x->constant_id = uVar2;
    }
    uVar2 = (pSVar4->m).c[0].id[1].id;
    if (uVar2 != 0) {
      (y->id).id = uVar2;
      uVar2 = ParsedIR::get_decoration(&this->ir,(ID)(pSVar4->m).c[0].id[1].id,DecorationSpecId);
      y->constant_id = uVar2;
    }
    uVar2 = (pSVar4->m).c[0].id[2].id;
    if (uVar2 == 0) goto LAB_002c804c;
    pIVar5 = (pSVar4->m).c[0].id + 2;
  }
  (z->id).id = uVar2;
  uVar2 = ParsedIR::get_decoration(&this->ir,(ID)pIVar5->id,DecorationSpecId);
  z->constant_id = uVar2;
LAB_002c804c:
  return *(uint32_t *)&p_Var1[0x1d]._M_nxt;
}

Assistant:

uint32_t Compiler::get_work_group_size_specialization_constants(SpecializationConstant &x, SpecializationConstant &y,
                                                                SpecializationConstant &z) const
{
	auto &execution = get_entry_point();
	x = { 0, 0 };
	y = { 0, 0 };
	z = { 0, 0 };

	// WorkgroupSize builtin takes precedence over LocalSize / LocalSizeId.
	if (execution.workgroup_size.constant != 0)
	{
		auto &c = get<SPIRConstant>(execution.workgroup_size.constant);

		if (c.m.c[0].id[0] != ID(0))
		{
			x.id = c.m.c[0].id[0];
			x.constant_id = get_decoration(c.m.c[0].id[0], DecorationSpecId);
		}

		if (c.m.c[0].id[1] != ID(0))
		{
			y.id = c.m.c[0].id[1];
			y.constant_id = get_decoration(c.m.c[0].id[1], DecorationSpecId);
		}

		if (c.m.c[0].id[2] != ID(0))
		{
			z.id = c.m.c[0].id[2];
			z.constant_id = get_decoration(c.m.c[0].id[2], DecorationSpecId);
		}
	}
	else if (execution.flags.get(ExecutionModeLocalSizeId))
	{
		auto &cx = get<SPIRConstant>(execution.workgroup_size.id_x);
		if (cx.specialization)
		{
			x.id = execution.workgroup_size.id_x;
			x.constant_id = get_decoration(execution.workgroup_size.id_x, DecorationSpecId);
		}

		auto &cy = get<SPIRConstant>(execution.workgroup_size.id_y);
		if (cy.specialization)
		{
			y.id = execution.workgroup_size.id_y;
			y.constant_id = get_decoration(execution.workgroup_size.id_y, DecorationSpecId);
		}

		auto &cz = get<SPIRConstant>(execution.workgroup_size.id_z);
		if (cz.specialization)
		{
			z.id = execution.workgroup_size.id_z;
			z.constant_id = get_decoration(execution.workgroup_size.id_z, DecorationSpecId);
		}
	}

	return execution.workgroup_size.constant;
}